

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t intersect_uint16_cardinality(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  
  if (lenB == 0 || lenA == 0) {
    return 0;
  }
  puVar1 = A + lenA;
  puVar2 = B + lenB;
  iVar4 = 0;
LAB_00102210:
  uVar5 = *B;
  do {
    uVar3 = *A;
    if (uVar5 <= uVar3) {
      while( true ) {
        uVar5 = *B;
        if (uVar3 <= uVar5) break;
        B = B + 1;
        if (B == puVar2) {
          return iVar4;
        }
      }
      if (uVar3 == uVar5) break;
    }
    A = A + 1;
    if (A == puVar1) {
      return iVar4;
    }
  } while( true );
  iVar4 = iVar4 + 1;
  A = A + 1;
  if (A == puVar1) {
    return iVar4;
  }
  B = B + 1;
  if (B == puVar2) {
    return iVar4;
  }
  goto LAB_00102210;
}

Assistant:

int32_t intersect_uint16_cardinality(const uint16_t *A, const size_t lenA,
                                     const uint16_t *B, const size_t lenB) {
    int32_t answer = 0;
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return answer;
        }
        while (*A > *B) {
            if (++B == endB) return answer;
        }
        if (*A == *B) {
            ++answer;
            if (++A == endA || ++B == endB) return answer;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    return answer;  // NOTREACHED
}